

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

missing_req_arg * __thiscall
boost::runtime::specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error>::
operator<<(specific_param_error<boost::runtime::missing_req_arg,_boost::runtime::input_error> *this,
          char *val)

{
  long in_RSI;
  missing_req_arg *in_RDI;
  missing_req_arg *in_stack_ffffffffffffffc8;
  missing_req_arg *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::append((char *)(in_RSI + 0x18));
  missing_req_arg::missing_req_arg(this_00,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }